

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

bool __thiscall
ON_DimStyle::Internal_SetDoubleMember
          (ON_DimStyle *this,field field_id,double value,double *class_member)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  
  bVar3 = ON_IsValid(value);
  if (bVar3) {
    dVar1 = *class_member;
    bVar3 = (bool)(-(value != dVar1) & 1);
    if ((dVar1 != value) || (NAN(dVar1) || NAN(value))) {
      *class_member = value;
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
      *(undefined4 *)((this->m_content_hash).m_digest + 0x10) =
           ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
      uVar2 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
      *(undefined8 *)(this->m_content_hash).m_digest = ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_
      ;
      *(undefined8 *)((this->m_content_hash).m_digest + 8) = uVar2;
    }
    Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_DimStyle::Internal_SetDoubleMember(
  ON_DimStyle::field field_id,
  double value,
  double& class_member
)
{
  bool bValueChanged = false;
  if (ON_IsValid(value))
  {
    // !(value == class_member) is used instead of (value != class_member)
    // so that when class_member = NaN, its value can be changed.
    if ( !(value == class_member) )
    {
      class_member = value;
      Internal_ContentChange();
      bValueChanged = true;
    }
    Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  }
  return bValueChanged;
}